

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_0::AsyncifyLocals::create(AsyncifyLocals *this)

{
  AsyncifyLocals *this_00;
  long in_RSI;
  
  this_00 = (AsyncifyLocals *)operator_new(0x1c8);
  AsyncifyLocals(this_00,*(ModuleAnalyzer **)(in_RSI + 0x130),(Type)*(uintptr_t *)(in_RSI + 0x138),
                 (Name)((IString *)(in_RSI + 0x140))->str);
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<AsyncifyLocals>(
      analyzer, pointerType, asyncifyMemory);
  }